

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigReference.cpp
# Opt level: O1

void deqp::egl::chooseConfigReference
               (Library *egl,EGLDisplay display,vector<void_*,_std::allocator<void_*>_> *dst,
               vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
               *attributes)

{
  vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *pvVar1;
  pointer pSVar2;
  pointer __last;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  AttribRule AVar6;
  vector<void_*,_std::allocator<void_*>_> eglConfigs;
  vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_> filteredConfigs;
  vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_> configs;
  vector<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_> configInfos;
  ConfigFilter configFilter;
  bool local_17a [2];
  vector<void_*,_std::allocator<void_*>_> local_178;
  vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *local_160;
  vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_> local_158;
  bool local_13c [4];
  vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_> local_138;
  vector<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_> local_118;
  vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> local_f8;
  _Iter_comp_iter<deqp::egl::CompareConfigs> local_e0;
  _Iter_comp_iter<deqp::egl::CompareConfigs> local_d8;
  SurfaceConfig local_d0;
  
  local_160 = attributes;
  eglu::getConfigs(&local_178,egl,display);
  local_118.super__Vector_base<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.super__Vector_base<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.super__Vector_base<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>::resize
            (&local_118,
             (long)local_178.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_178.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  if (local_178.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_178.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      eglu::queryCoreConfigInfo
                (egl,display,
                 local_178.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar3],
                 (ConfigInfo *)
                 ((long)&(local_118.
                          super__Vector_base<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>.
                          _M_impl.super__Vector_impl_data._M_start)->bufferSize + lVar4));
      eglu::queryExtConfigInfo
                (egl,display,
                 local_178.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar3],
                 (ConfigInfo *)
                 ((long)&(local_118.
                          super__Vector_base<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>.
                          _M_impl.super__Vector_impl_data._M_start)->bufferSize + lVar4));
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x98;
    } while (uVar3 < (ulong)((long)local_178.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_178.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  local_138.super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>.
  _M_impl.super__Vector_impl_data._M_finish = (SurfaceConfig *)0x0;
  local_138.super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (SurfaceConfig *)0x0;
  if (local_178.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_178.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      local_d0.m_config =
           local_178.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
           super__Vector_impl_data._M_start[uVar3];
      memcpy(&local_d0.m_info,
             (void *)((long)&(local_118.
                              super__Vector_base<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start)->bufferSize + lVar4),0x98);
      pSVar2 = local_138.
               super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_138.
          super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_138.
          super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>::
        _M_realloc_insert<deqp::egl::SurfaceConfig>
                  (&local_138,
                   (iterator)
                   local_138.
                   super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_d0);
      }
      else {
        memcpy(local_138.
               super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_d0,0xa0);
        local_138.
        super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>.
        _M_impl.super__Vector_impl_data._M_finish = pSVar2 + 1;
      }
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x98;
    } while (uVar3 < (ulong)((long)local_178.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_178.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  SurfaceConfig::getDefaultRules();
  std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::vector
            (&local_f8,local_160);
  ConfigFilter::setValues((ConfigFilter *)&local_d0,&local_f8);
  if (local_f8.
      super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.
                    super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.
                          super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.
                          super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ConfigFilter::filter(&local_158,(ConfigFilter *)&local_d0,&local_138);
  __last = local_158.
           super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pSVar2 = local_158.
           super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>.
           _M_impl.super__Vector_impl_data._M_start;
  ConfigFilter::getSpecifiedRGBColors((ConfigFilter *)local_13c);
  ConfigFilter::getSpecifiedLuminanceColors((ConfigFilter *)local_17a);
  AVar6 = ConfigFilter::getAttribute((ConfigFilter *)&local_d0,0x331a);
  bVar5 = (uint)((ulong)(AVar6._0_8_ + -0x100000000) >> 0x21) < 0x7fffffff;
  if (pSVar2 != __last) {
    uVar3 = ((long)__last - (long)pSVar2 >> 5) * -0x3333333333333333;
    lVar4 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    local_d8._M_comp.m_specifiedRGBColors.m_data[0] = local_13c[0];
    local_d8._M_comp.m_specifiedRGBColors.m_data[1] = local_13c[1];
    local_d8._M_comp.m_specifiedRGBColors.m_data[2] = local_13c[2];
    local_d8._M_comp.m_specifiedRGBColors.m_data[3] = local_13c[3];
    local_160 = (vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                 *)CONCAT62(local_160._2_6_,local_17a);
    local_d8._M_comp.m_specifiedLuminanceColors.m_data[0] = local_17a[0];
    local_d8._M_comp.m_specifiedLuminanceColors.m_data[1] = local_17a[1];
    local_d8._M_comp.m_yuvPlaneBppSpecified = bVar5;
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<deqp::egl::SurfaceConfig*,std::vector<deqp::egl::SurfaceConfig,std::allocator<deqp::egl::SurfaceConfig>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<deqp::egl::CompareConfigs>>
              ((__normal_iterator<deqp::egl::SurfaceConfig_*,_std::vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>_>
                )pSVar2,(__normal_iterator<deqp::egl::SurfaceConfig_*,_std::vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>_>
                         )__last,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,&local_d8);
    pvVar1 = local_160;
    local_e0._M_comp.m_specifiedRGBColors.m_data[0] = local_13c[0];
    local_e0._M_comp.m_specifiedRGBColors.m_data[1] = local_13c[1];
    local_e0._M_comp.m_specifiedRGBColors.m_data[2] = local_13c[2];
    local_e0._M_comp.m_specifiedRGBColors.m_data[3] = local_13c[3];
    local_e0._M_comp.m_specifiedLuminanceColors.m_data[0] = local_160._0_1_;
    local_e0._M_comp.m_specifiedLuminanceColors.m_data[1] = local_160._1_1_;
    local_160 = pvVar1;
    local_e0._M_comp.m_yuvPlaneBppSpecified = bVar5;
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<deqp::egl::SurfaceConfig*,std::vector<deqp::egl::SurfaceConfig,std::allocator<deqp::egl::SurfaceConfig>>>,__gnu_cxx::__ops::_Iter_comp_iter<deqp::egl::CompareConfigs>>
              ((__normal_iterator<deqp::egl::SurfaceConfig_*,_std::vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>_>
                )pSVar2,(__normal_iterator<deqp::egl::SurfaceConfig_*,_std::vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>_>
                         )__last,&local_e0);
  }
  std::vector<void_*,_std::allocator<void_*>_>::resize
            (dst,((long)local_158.
                        super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_158.
                        super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x3333333333333333);
  if (local_158.
      super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_158.
      super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      (dst->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.super__Vector_impl_data.
      _M_start[uVar3] =
           *(void **)((long)&(local_158.
                              super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_config + lVar4);
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0xa0;
    } while (uVar3 < (ulong)(((long)local_158.
                                    super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_158.
                                    super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5) *
                            -0x3333333333333333));
  }
  if (local_158.
      super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>.
      _M_impl.super__Vector_impl_data._M_start != (SurfaceConfig *)0x0) {
    operator_delete(local_158.
                    super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.
                          super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.
                          super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_deqp::egl::AttribRule>,_std::_Select1st<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_deqp::egl::AttribRule>,_std::_Select1st<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
               *)&local_d0);
  if (local_138.
      super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.
                    super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_138.
                          super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.
                          super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_118.super__Vector_base<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.
                    super__Vector_base<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_178.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_178.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_178.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void chooseConfigReference (const Library& egl, EGLDisplay display, std::vector<EGLConfig>& dst, const std::vector<std::pair<EGLenum, EGLint> >& attributes)
{
	// Get all configs
	std::vector<EGLConfig> eglConfigs = eglu::getConfigs(egl, display);

	// Config infos - including extension attributes
	std::vector<ConfigInfo> configInfos;
	configInfos.resize(eglConfigs.size());

	for (size_t ndx = 0; ndx < eglConfigs.size(); ndx++)
	{
		eglu::queryCoreConfigInfo(egl, display, eglConfigs[ndx], &configInfos[ndx]);
		eglu::queryExtConfigInfo(egl, display, eglConfigs[ndx], &configInfos[ndx]);
	}

	// Pair configs with info
	std::vector<SurfaceConfig> configs;
	for (size_t ndx = 0; ndx < eglConfigs.size(); ndx++)
		configs.push_back(SurfaceConfig(eglConfigs[ndx], configInfos[ndx]));

	// Filter configs
	ConfigFilter configFilter;
	configFilter.setValues(attributes);

	std::vector<SurfaceConfig> filteredConfigs = configFilter.filter(configs);

	// Sort configs
	std::sort(filteredConfigs.begin(), filteredConfigs.end(), CompareConfigs(configFilter.getSpecifiedRGBColors(), configFilter.getSpecifiedLuminanceColors(), configFilter.isYuvPlaneBppSpecified()));

	// Write to dst list
	dst.resize(filteredConfigs.size());
	for (size_t ndx = 0; ndx < filteredConfigs.size(); ndx++)
		dst[ndx] = filteredConfigs[ndx].getEglConfig();
}